

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_lha.c
# Opt level: O3

int verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  char cVar1;
  int iVar2;
  wchar_t wVar3;
  mode_t mVar4;
  int iVar5;
  archive *paVar6;
  time_t tVar7;
  time_t tVar8;
  char *pcVar9;
  int64_t v2;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  uchar *puVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  archive_entry *ae_1;
  archive_entry *ae;
  archive_entry *local_58;
  int local_4c;
  archive *local_48;
  uchar *local_40;
  archive_entry *local_38;
  
  local_40 = sig;
  paVar6 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'\x96',(uint)(paVar6 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_format_all(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'\x97',0,"0",(long)iVar2,"archive_read_support_format_all(a)",paVar6);
  iVar2 = archive_read_support_filter_all(paVar6);
  iVar5 = (int)siglen;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'\x98',0,"0",(long)iVar2,"archive_read_support_filter_all(a)",paVar6);
  if (iVar5 != 0) {
    wVar3 = archive_read_set_option(paVar6,(char *)0x0,"rockridge",(char *)0x0);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'\x9b',(uint)(wVar3 == L'\0'),
                     "0 == archive_read_set_option(a, NULL, \"rockridge\", NULL)",paVar6);
    if (iVar5 != 1) {
      wVar3 = archive_read_set_option(paVar6,(char *)0x0,"joliet",(char *)0x0);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                       ,L'\x9e',(uint)(wVar3 == L'\0'),
                       "0 == archive_read_set_option(a, NULL, \"joliet\", NULL)",paVar6);
    }
  }
  iVar2 = archive_read_open_memory(paVar6,ctx,(size_t)local_40);
  local_4c = iVar5;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'\x9f',0,"0",(long)iVar2,"archive_read_open_memory(a, buff, used)",paVar6);
  iVar2 = archive_read_next_header(paVar6,&local_38);
  local_48 = paVar6;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'¥',0,"0",(long)iVar2,"archive_read_next_header(a, &ae)",paVar6);
  tVar7 = archive_entry_atime(local_38);
  tVar8 = archive_entry_ctime(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'¦',tVar7,"archive_entry_atime(ae)",tVar8,"archive_entry_ctime(ae)",
                      (void *)0x0);
  tVar7 = archive_entry_atime(local_38);
  tVar8 = archive_entry_mtime(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'§',tVar7,"archive_entry_atime(ae)",tVar8,"archive_entry_mtime(ae)",
                      (void *)0x0);
  pcVar9 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
             ,L'¨',".","\".\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar4 = archive_entry_mode(local_38);
  paVar6 = local_48;
  iVar2 = local_4c;
  if (local_4c == 2) {
    wVar3 = L'±';
  }
  else {
    if (local_4c != 1) {
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                       ,L'«',(uint)(mVar4 == 0x416d),"(S_IFDIR | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      goto LAB_001c861a;
    }
    wVar3 = L'®';
  }
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,wVar3,(uint)(mVar4 == 0x41c0),"(S_IFDIR | 0700) == archive_entry_mode(ae)",
                   (void *)0x0);
  paVar6 = local_48;
LAB_001c861a:
  memset(*(void **)(tbs + 0x30),0,*(long *)(tbs + 0x20) << 3);
  tbs[0x28] = '\0';
  tbs[0x29] = '\0';
  tbs[0x2a] = '\0';
  tbs[0x2b] = '\0';
  if (*(long *)(tbs + 0x20) != 0) {
    puVar13 = (uchar *)0x0;
    do {
      local_40 = puVar13;
      iVar5 = archive_read_next_header(paVar6,&local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'N',0,"0",(long)iVar5,"archive_read_next_header(a, &ae)",paVar6);
      if (iVar2 == 0) {
        tVar7 = archive_entry_birthtime(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                            ,L'P',2,"2",tVar7,"archive_entry_birthtime(ae)",(void *)0x0);
        tVar7 = archive_entry_atime(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                            ,L'Q',3,"3",tVar7,"archive_entry_atime(ae)",(void *)0x0);
        tVar7 = archive_entry_ctime(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                            ,L'R',4,"4",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
      }
      else {
        wVar3 = archive_entry_birthtime_is_set(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                            ,L'T',0,"0",(long)wVar3,"archive_entry_birthtime_is_set(ae)",(void *)0x0
                           );
        tVar7 = archive_entry_atime(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                            ,L'U',5,"5",tVar7,"archive_entry_atime(ae)",(void *)0x0);
        tVar7 = archive_entry_ctime(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                            ,L'V',5,"5",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
      }
      tVar7 = archive_entry_mtime(local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L'X',5,"5",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
      mVar4 = archive_entry_mode(local_58);
      if (iVar2 == 0) {
        bVar16 = mVar4 == 0x816d;
        wVar3 = L'Z';
        pcVar9 = "(S_IFREG | 0555) == archive_entry_mode(ae)";
      }
      else {
        bVar16 = mVar4 == 0x8100;
        wVar3 = L'\\';
        pcVar9 = "(S_IFREG | 0400) == archive_entry_mode(ae)";
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                       ,wVar3,(uint)bVar16,pcVar9,(void *)0x0);
      v2 = archive_entry_size(local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                          ,L']',0,"0",v2,"archive_entry_size(ae)",(void *)0x0);
      if (0 < *(int *)(tbs + 0x28)) {
        lVar14 = 0;
        do {
          pcVar9 = archive_entry_pathname(local_58);
          pcVar10 = archive_entry_symlink(local_58);
          if (pcVar10 != (char *)0x0) {
            sVar11 = strlen(pcVar10);
            wVar3 = L'\x01';
            if ((sVar11 != 1) && (sVar11 != 0x80)) {
              wVar3 = (wchar_t)(sVar11 == 0xff);
            }
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                             ,L'j',wVar3,"length == 1 || length == 128 || length == 255",(void *)0x0
                            );
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                                ,L'k',(long)pcVar10[sVar11 - 1],"symlinkname[length-1]",0x78,"\'x\'"
                                ,(void *)0x0);
          }
          failure("Found duplicate for %s",pcVar9);
          iVar2 = strcmp(*(char **)(*(long *)(tbs + 0x30) + lVar14 * 8),pcVar9);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                           ,L'n',(uint)(iVar2 != 0),"strcmp(fns->names[i], pathname) != 0",
                           (void *)0x0);
          sVar11 = strlen(pcVar9);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                           ,L'o',(uint)(sVar11 <= *(ulong *)tbs),
                           "(length = strlen(pathname)) <= fns->maxlen",(void *)0x0);
          if (*(ulong *)(tbs + 8) < sVar11) {
            *(size_t *)(tbs + 8) = sVar11;
          }
          pcVar10 = strrchr(pcVar9,0x2e);
          if (pcVar10 != (char *)0x0) {
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                             ,L'u',(uint)((ulong)((long)pcVar10 - (long)pcVar9) <=
                                         *(ulong *)(tbs + 0x10)),
                             "(size_t)(p - pathname) <= fns->maxflen",(void *)0x0);
            sVar11 = strlen(pcVar10 + 1);
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                             ,L'w',(uint)(sVar11 <= *(ulong *)(tbs + 0x18)),
                             "strlen(p+1) <= fns->maxelen",(void *)0x0);
            if ((tbs[0x38] & 2) != 0) {
              pcVar12 = strchr(pcVar9,0x2e);
              assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                               ,L'z',(uint)(pcVar12 == pcVar10),"strchr(pathname, \'.\') == p",
                               (void *)0x0);
            }
          }
          cVar1 = *pcVar9;
          pcVar10 = pcVar9;
          while ((cVar1 != '\0' && (pcVar10 = pcVar10 + 1, (tbs[0x38] & 1) != 0))) {
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                             ,L'\x80',(uint)((byte)(cVar1 + 0x85U) < 0xe6),
                             "*p < \'a\' || *p > \'z\'",(void *)0x0);
            cVar1 = *pcVar10;
          }
          if ((tbs[0x38] & 4) == 0) {
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                             ,L'\x86',(uint)(*pcVar9 != '.'),"*pathname != \'.\'",(void *)0x0);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < *(int *)(tbs + 0x28));
      }
      pcVar9 = archive_entry_pathname(local_58);
      pcVar9 = strdup(pcVar9);
      paVar6 = local_48;
      iVar2 = *(int *)(tbs + 0x28);
      *(int *)(tbs + 0x28) = iVar2 + 1;
      *(char **)(*(long *)(tbs + 0x30) + (long)iVar2 * 8) = pcVar9;
      puVar13 = local_40 + 1;
      iVar2 = local_4c;
    } while (puVar13 < *(uchar **)(tbs + 0x20));
    if (*(uchar **)(tbs + 0x20) != (uchar *)0x0) {
      uVar15 = 0;
      do {
        free(*(void **)(*(long *)(tbs + 0x30) + uVar15 * 8));
        uVar15 = uVar15 + 1;
      } while (uVar15 < *(ulong *)(tbs + 0x20));
    }
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'¾',(long)*(int *)(tbs + 8),"(int)fns->longest_len",(long)*(int *)tbs,
                      "(int)fns->maxlen",(void *)0x0);
  iVar2 = archive_read_next_header(paVar6,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'Ã',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",paVar6);
  iVar2 = archive_read_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar6);
  iVar2 = archive_read_free(paVar6);
  wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                              ,L'Å',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",paVar6);
  return wVar3;
}

Assistant:

static void
verify(const char *refname, int posix)
{
	struct archive_entry *ae;
	struct archive *a;
	char buff[128];
	const void *pv;
	size_t s;
	int64_t o;
	int uid, gid;

	if (posix)
		uid = gid = 1001;
	else
		uid = gid = 0;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify directory1.  */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	if (posix)
		assertEqualInt((AE_IFDIR | 0750), archive_entry_mode(ae));
	else
		assertEqualInt((AE_IFDIR | 0755), archive_entry_mode(ae));
	assertEqualString("dir/", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(uid, archive_entry_uid(ae));
	assertEqualInt(gid, archive_entry_gid(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_data_block(a, &pv, &s, &o));
	assertEqualInt(s, 0);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify directory2.  */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFDIR | 0755), archive_entry_mode(ae));
	assertEqualString("dir2/", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(uid, archive_entry_uid(ae));
	assertEqualInt(gid, archive_entry_gid(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_data_block(a, &pv, &s, &o));
	assertEqualInt(s, 0);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	if (posix) {
		/* Verify symbolic link file1. */
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt((AE_IFLNK | 0755), archive_entry_mode(ae));
		assertEqualString("dir2/symlink1", archive_entry_pathname(ae));
		assertEqualString("../file1", archive_entry_symlink(ae));
		assertEqualInt(172802, archive_entry_mtime(ae));
		assertEqualInt(uid, archive_entry_uid(ae));
		assertEqualInt(gid, archive_entry_gid(ae));
		assertEqualInt(0, archive_entry_size(ae));
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		/* Verify symbolic link file2. */
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt((AE_IFLNK | 0755), archive_entry_mode(ae));
		assertEqualString("dir2/symlink2", archive_entry_pathname(ae));
		assertEqualString("../file2", archive_entry_symlink(ae));
		assertEqualInt(172802, archive_entry_mtime(ae));
		assertEqualInt(uid, archive_entry_uid(ae));
		assertEqualInt(gid, archive_entry_gid(ae));
		assertEqualInt(0, archive_entry_size(ae));
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	}

	/* Verify regular file1. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("file1", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(uid, archive_entry_uid(ae));
	assertEqualInt(gid, archive_entry_gid(ae));
	assertEqualInt(file1_size, archive_entry_size(ae));
	assertEqualInt(file1_size, archive_read_data(a, buff, file1_size));
	assertEqualMem(buff, file1, file1_size);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify regular file2. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	if (posix)
		assertEqualInt((AE_IFREG | 0666), archive_entry_mode(ae));
	else
		assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(uid, archive_entry_uid(ae));
	assertEqualInt(gid, archive_entry_gid(ae));
	assertEqualInt(file2_size, archive_entry_size(ae));
	assertEqualInt(file2_size, archive_read_data(a, buff, file2_size));
	assertEqualMem(buff, file2, file2_size);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify the number of files read. */
	if (posix) {
		assertEqualInt(6, archive_file_count(a));
	} else {
		assertEqualInt(4, archive_file_count(a));
	}

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify the number of files read. */
	if (posix) {
		assertEqualInt(6, archive_file_count(a));
	} else {
		assertEqualInt(4, archive_file_count(a));
	}

	/* Verify encryption status */
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_LHA, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}